

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastBS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  ParseContext *pPVar2;
  ushort *puVar3;
  ulong uVar4;
  char *pcVar5;
  uint *puVar6;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 arena;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ulong hasbits_00;
  ParseContext *ptr_00;
  TcParseTableBase *pTVar7;
  ArenaStringPtr *field;
  ParseContext *ptr_01;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar5 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  pTVar7 = table;
  field = (ArenaStringPtr *)hasbits;
  pPVar2 = (ParseContext *)
           RefAt<google::protobuf::internal::ArenaStringPtr>(msg,(ulong)data.field_0 >> 0x30);
  arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
  if ((arena.data & 1) != 0) {
    arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
            ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(arena.data & 0xfffffffffffffffe))->data;
  }
  ptr_01 = (ParseContext *)(ptr + 1);
  if ((Arena *)arena.data == (Arena *)0x0) {
    ptr_00 = ctx;
    puVar3 = (ushort *)
             anon_unknown_142::ReadStringNoArena
                       ((MessageLite *)ptr_01,(char *)ctx,pPVar2,0,pTVar7,field);
    pPVar2 = extraout_RDX_00;
  }
  else {
    puVar3 = (ushort *)
             EpsCopyInputStream::ReadArenaString
                       (&ctx->super_EpsCopyInputStream,(char *)ptr_01,(ArenaStringPtr *)pPVar2,
                        (Arena *)arena);
    pPVar2 = extraout_RDX;
    ptr_00 = ptr_01;
  }
  hasbits_00 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  if (puVar3 == (ushort *)0x0) {
    pcVar5 = Error(msg,(char *)ptr_00,pPVar2,(TcFieldData)arena,table,hasbits_00);
    return pcVar5;
  }
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar3) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar6 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar6 = *puVar6 | (uint)hasbits_00;
    }
    return (char *)puVar3;
  }
  uVar1 = (uint)table->fast_idx_mask & (uint)*puVar3;
  if ((uVar1 & 7) == 0) {
    uVar4 = (ulong)(uVar1 & 0xfffffff8);
    pcVar5 = (char *)(**(code **)(&table[1].has_bits_offset + uVar4))
                               (msg,puVar3,ctx,
                                (ulong)*puVar3 ^ *(ulong *)(&table[1].fast_idx_mask + uVar4 * 2),
                                table,hasbits_00);
    return pcVar5;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x44d);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastBS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularString<uint8_t, ArenaStringPtr, kNoUtf8>(
      PROTOBUF_TC_PARAM_PASS);
}